

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

Zyx_Man_t * Zyx_ManAlloc(Bmc_EsPar_t *pPars,word *pTruth)

{
  int iVar1;
  Zyx_Man_t *p_00;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  bmcg_sat_solver *pbVar4;
  Vec_Bit_t *pVVar5;
  word *local_28;
  Zyx_Man_t *p;
  word *pTruth_local;
  Bmc_EsPar_t *pPars_local;
  
  p_00 = (Zyx_Man_t *)calloc(1,0x2278);
  p_00->pPars = pPars;
  p_00->pTruth = pTruth;
  p_00->nObjs = p_00->pPars->nVars + p_00->pPars->nNodes;
  iVar1 = Abc_TtWordNum(p_00->pPars->nVars);
  p_00->nWords = iVar1;
  p_00->LutMask = (1 << ((byte)p_00->pPars->nLutSize & 0x1f)) + -1;
  p_00->TopoBase = (1 << ((byte)p_00->pPars->nLutSize & 0x1f)) * p_00->pPars->nNodes;
  p_00->MintBase = p_00->TopoBase + p_00->pPars->nNodes * p_00->nObjs;
  pVVar2 = Vec_IntStartFull(p_00->MintBase + (1 << ((byte)p_00->pPars->nVars & 0x1f)) * p_00->nObjs)
  ;
  p_00->vVarValues = pVVar2;
  pVVar2 = Vec_IntAlloc(1 << ((byte)p_00->pPars->nVars & 0x1f));
  p_00->vMidMints = pVVar2;
  pVVar3 = Zyx_ManTruthTables(p_00,pTruth);
  p_00->vInfo = pVVar3;
  local_28 = pTruth;
  if (p_00->pPars->fMajority != 0) {
    local_28 = Zyx_ManTruth(p_00,p_00->nObjs);
  }
  pVVar2 = Zyx_ManCreateSymVarPairs(local_28,p_00->pPars->nVars);
  p_00->vPairs = pVVar2;
  pbVar4 = bmcg_sat_solver_start();
  p_00->pSat = pbVar4;
  if (pPars->fUseIncr != 0) {
    if ((p_00->pPars->nLutSize == 2) || (p_00->pPars->fMajority != 0)) {
      pVVar5 = Vec_BitStart((1 << ((byte)p_00->pPars->nVars & 0x1f)) * p_00->pPars->nNodes *
                            p_00->nObjs * p_00->nObjs);
      p_00->vUsed2 = pVVar5;
    }
    else if (p_00->pPars->nLutSize == 3) {
      pVVar5 = Vec_BitStart((1 << ((byte)p_00->pPars->nVars & 0x1f)) * p_00->pPars->nNodes *
                            p_00->nObjs * p_00->nObjs * p_00->nObjs);
      p_00->vUsed3 = pVVar5;
    }
  }
  bmcg_sat_solver_set_nvars
            (p_00->pSat,p_00->MintBase + (1 << ((byte)p_00->pPars->nVars & 0x1f)) * p_00->nObjs);
  Zyx_ManSetupVars(p_00);
  Zyx_ManAddCnfStart(p_00);
  Zyx_ManPrintVarMap(p_00,0);
  return p_00;
}

Assistant:

Zyx_Man_t * Zyx_ManAlloc( Bmc_EsPar_t * pPars, word * pTruth )
{
    Zyx_Man_t * p = ABC_CALLOC( Zyx_Man_t, 1 );
    p->pPars      = pPars;
    p->pTruth     = pTruth;
    p->nObjs      = p->pPars->nVars + p->pPars->nNodes;
    p->nWords     = Abc_TtWordNum(p->pPars->nVars);
    p->LutMask    = (1 << p->pPars->nLutSize) - 1;
    p->TopoBase   = (1 << p->pPars->nLutSize) * p->pPars->nNodes;
    p->MintBase   = p->TopoBase + p->pPars->nNodes * p->nObjs;
    p->vVarValues = Vec_IntStartFull( p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    p->vMidMints  = Vec_IntAlloc( 1 << p->pPars->nVars );
    p->vInfo      = Zyx_ManTruthTables( p, pTruth );
    p->vPairs     = Zyx_ManCreateSymVarPairs( p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : pTruth, p->pPars->nVars );
    p->pSat       = bmcg_sat_solver_start();
    if ( pPars->fUseIncr )
    {
        if ( p->pPars->nLutSize == 2 || p->pPars->fMajority )
            p->vUsed2     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs );
        else if ( p->pPars->nLutSize == 3 )
            p->vUsed3     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs * p->nObjs );
    }
    bmcg_sat_solver_set_nvars( p->pSat, p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    Zyx_ManSetupVars( p );
    Zyx_ManAddCnfStart( p );
    Zyx_ManPrintVarMap( p, 0 );
    return p;
}